

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  void *pvVar2;
  pointer pmVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pdVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  size_t i_1;
  size_t i_8;
  double dVar11;
  long lVar12;
  uint uVar13;
  double dVar14;
  size_t i_2;
  long lVar15;
  size_t i;
  long lVar16;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  B;
  timeval tval_1;
  vector<double,_std::allocator<double>_> B_values;
  timeval tval_5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_cols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_rows;
  vector<double,_std::allocator<double>_> A_csr_values;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  A_map;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  A_flatmap;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  local_148;
  pointer local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  double local_110;
  pointer local_108;
  int local_fc;
  vector<double,_std::allocator<double>_> local_f8;
  int local_d4;
  timeval local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  local_60;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  local_48;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Missing argument: Matrix-dimension, Nonzeros/row",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    iVar7 = 1;
  }
  else {
    local_fc = atoi(argv[1]);
    dVar11 = (double)(long)local_fc;
    local_d4 = atoi(argv[2]);
    local_108 = (pointer)operator_new(0x50);
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_108 + 10;
    *local_108 = 0.0;
    local_108[1] = 0.0;
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[4] = 0.0;
    local_108[5] = 0.0;
    local_108[6] = 0.0;
    local_108[7] = 0.0;
    local_108[8] = 0.0;
    local_108[9] = 0.0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_108;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::vector(&local_60,(size_type)dVar11,(allocator_type *)&local_48);
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::vector(&local_48,(size_type)dVar11,(allocator_type *)&local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_90,(long)dVar11 + 1,(allocator_type *)&local_c0);
    lVar15 = (long)local_d4;
    if (local_fc == 0) {
      uVar13 = 0;
    }
    else {
      dVar14 = 0.0;
      uVar13 = 0;
      do {
        local_130 = (pointer)CONCAT44(local_130._4_4_,uVar13);
        lVar16 = lVar15;
        if (local_d4 != 0) {
          do {
            iVar7 = rand();
            local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 (undefined4)((ulong)(long)iVar7 % (ulong)dVar11);
            iVar7 = rand();
            local_110 = (double)iVar7 / 2147483647.0 + 1.0;
            pmVar8 = std::
                     map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                     ::operator[](local_60.
                                  super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)dVar14,
                                  (key_type *)&local_c0);
            *pmVar8 = local_110;
            pmVar8 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>
                     ::priv_subscript(local_48.
                                      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar14,
                                      (key_type *)&local_c0);
            *pmVar8 = local_110;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)dVar14] = (uint)local_130;
        uVar13 = (uint)local_130 +
                 (int)local_60.
                      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)dVar14]._M_t._M_impl.
                      super__Rb_tree_header._M_node_count;
        dVar14 = (double)((long)dVar14 + 1);
      } while (dVar14 != dVar11);
    }
    local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[(long)dVar11] = uVar13;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_c0,(ulong)uVar13,(allocator_type *)&local_78);
    local_110 = dVar11;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_78,(ulong)uVar13,(allocator_type *)&local_148);
    pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_fc != 0) {
      local_130 = local_60.
                  super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
      dVar11 = 0.0;
      lVar12 = 0;
      do {
        pmVar3 = local_130 + (long)dVar11;
        p_Var9 = local_130[(long)dVar11]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
          *(_Rb_tree_color *)(lVar16 + lVar12 * 4) = p_Var9[1]._M_color;
          pdVar6[lVar12] = (double)p_Var9[1]._M_parent;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          lVar12 = lVar12 + 1;
        }
        dVar11 = (double)((long)dVar11 + 1);
      } while (dVar11 != local_110);
    }
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
    lVar16 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&local_60,
                 (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)&local_148);
      local_130 = (pointer)(double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar16] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)&local_148);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 10);
    print_median(&local_a8);
    uVar1 = lVar15 * 2;
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      lVar16 = (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start * 1000000 +
               (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(&local_148,(size_type)local_110,(allocator_type *)&local_128);
      if (local_fc != 0) {
        lVar12 = 0;
        dVar11 = local_110;
        do {
          if (*(ulong *)((long)&((local_148.
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                m_seq.m_holder.m_capacity + lVar12) < uVar1) {
            boost::container::
            vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
            ::priv_reserve_no_capacity
                      ((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                        *)((long)&((local_148.
                                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                  m_seq.m_holder.m_start + lVar12),uVar1);
          }
          lVar12 = lVar12 + 0x18;
          dVar11 = (double)((long)dVar11 - 1);
        } while (dVar11 != 0.0);
      }
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&local_60,&local_148);
      local_130 = (pointer)(double)lVar16;
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector(&local_148);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
                (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_148,
                 &local_128,&local_f8);
      local_130 = (pointer)(double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday(&local_d0,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(local_d0.tv_sec * 1000000 + local_d0.tv_usec) - (double)local_130) / 1000000.0;
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.
          super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.
                        super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&local_48,
                 (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)&local_148);
      local_130 = (pointer)(double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)&local_148);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      lVar16 = (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start * 1000000 +
               (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(&local_148,(size_type)local_110,(allocator_type *)&local_128);
      if (local_fc != 0) {
        lVar12 = 0;
        dVar11 = local_110;
        do {
          if (*(ulong *)((long)&((local_148.
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                m_seq.m_holder.m_capacity + lVar12) < uVar1) {
            boost::container::
            vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
            ::priv_reserve_no_capacity
                      ((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                        *)((long)&((local_148.
                                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                  m_seq.m_holder.m_start + lVar12),uVar1);
          }
          lVar12 = lVar12 + 0x18;
          dVar11 = (double)((long)dVar11 - 1);
        } while (dVar11 != 0.0);
      }
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&local_48,&local_148);
      local_130 = (pointer)(double)lVar16;
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector(&local_148);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
                (&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_148,
                 &local_128,&local_f8);
      local_130 = (pointer)(double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday(&local_d0,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(local_d0.tv_sec * 1000000 + local_d0.tv_usec) - (double)local_130) / 1000000.0;
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.
          super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.
                        super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<unsigned_int,double,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&local_90,&local_c0,&local_78,
                 (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)&local_148);
      local_130 = (pointer)(double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)&local_148);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      lVar16 = (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start * 1000000 +
               (long)local_148.
                     super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(&local_148,(size_type)local_110,(allocator_type *)&local_128);
      if (local_fc != 0) {
        lVar12 = 0;
        dVar11 = local_110;
        do {
          if (*(ulong *)((long)&((local_148.
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                m_seq.m_holder.m_capacity + lVar12) < uVar1) {
            boost::container::
            vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
            ::priv_reserve_no_capacity
                      ((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                        *)((long)&((local_148.
                                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_flat_tree).m_data.
                                  m_seq.m_holder.m_start + lVar12),uVar1);
          }
          lVar12 = lVar12 + 0x18;
          dVar11 = (double)((long)dVar11 - 1);
        } while (dVar11 != 0.0);
      }
      run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&local_90,&local_c0,&local_78,&local_148);
      local_130 = (pointer)(double)lVar16;
      gettimeofday((timeval *)&local_128,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(long)(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start * 250000) -
           (double)local_130) / 1000000.0;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector(&local_148);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    lVar15 = 0;
    do {
      gettimeofday((timeval *)&local_148,(__timezone_ptr_t)0x0);
      pfVar5 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = local_148.
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      run<unsigned_int,double>
                (&local_90,&local_c0,&local_78,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_148,&local_128,
                 &local_f8);
      local_110 = (double)((long)pfVar4 * 1000000 + (long)pfVar5);
      gettimeofday(&local_d0,(__timezone_ptr_t)0x0);
      local_108[lVar15] =
           ((double)(local_d0.tv_sec * 1000000 + local_d0.tv_usec) - local_110) / 1000000.0;
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.
          super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.
                        super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
    print_median(&local_a8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar2 = (void *)CONCAT44(local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_c0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2)
      ;
    }
    if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::~vector(&local_48);
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::~vector(&local_60);
    operator_delete(local_108,0x50);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 3)
  {
    std::cout << "Missing argument: Matrix-dimension, Nonzeros/row" << std::endl;
    return EXIT_FAILURE;
  }

  std::size_t runs = 10;
  std::size_t N = atoi(argv[1]);
  std::size_t nnz_per_row = atoi(argv[2]);
  std::vector<double> exec_times(runs);

  //
  // Matrix initialization
  //
  std::vector< std::map<unsigned int, double> > A_map(N);
  std::vector< boost::container::flat_map<unsigned int, double> > A_flatmap(N);
  std::vector< unsigned int > A_csr_rows(N+1);

  unsigned int total_nnz = 0;
  for (std::size_t row=0; row<N; ++row)
  {
    for (std::size_t j=0; j<nnz_per_row; ++j)
    {
      unsigned int col_idx = rand() % N;
      double value = 1.0 + double(rand()) / double(RAND_MAX);
      A_map[row][col_idx] = value;
      A_flatmap[row][col_idx] = value;
    }
    A_csr_rows[row] = total_nnz;
    total_nnz += A_map[row].size();
  }
  A_csr_rows[N] = total_nnz;

  std::vector<unsigned int> A_csr_cols(total_nnz);
  std::vector<double> A_csr_values(total_nnz);

  std::size_t index = 0;
  for (std::size_t row=0; row<N; ++row)
    for (std::map<unsigned int, double>::const_iterator it = A_map[row].begin(); it != A_map[row].end(); ++it, ++index)
    {
      A_csr_cols[index] = it->first;
      A_csr_values[index] = it->second;
    }


  //
  // Run benchmarks
  //
  //std::cout << "# Size  map->map  map->flatmap  mat->csr     flatmap->map  flatmap->flatmap  flatmap->csr      csr->map  csr->flatmap  csr->csr" << std::endl;
  std::cout << N << "    ";

  Timer timer;

  // map to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_map, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // flatmap to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_flatmap, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // csr to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_csr_rows, A_csr_cols, A_csr_values, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << std::endl;

  return EXIT_SUCCESS;
}